

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter<spdlog::details::scoped_padder>::format
          (pid_formatter<spdlog::details::scoped_padder> *this,log_msg *param_1,tm *param_2,
          memory_buf_t *dest)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  scoped_padder p;
  scoped_padder local_60;
  byte abStack_2a [5];
  undefined2 local_25;
  char local_23 [3];
  char *local_20;
  
  uVar2 = getpid();
  uVar3 = 0x1f;
  if ((uVar2 | 1) != 0) {
    for (; (uVar2 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
    }
  }
  scoped_padder::scoped_padder
            (&local_60,
             (ulong)uVar2 +
             *(long *)(::fmt::v9::detail::do_count_digits(unsigned_int)::table + (ulong)uVar3 * 8)
             >> 0x20,&(this->super_flag_formatter).padinfo_,dest);
  pcVar4 = local_23;
  uVar3 = uVar2;
  if (99 < uVar2) {
    do {
      uVar2 = uVar3 / 100;
      *(undefined2 *)(pcVar4 + -2) =
           *(undefined2 *)
            (
            "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
            + (ulong)(uVar3 % 100) * 2);
      pcVar4 = pcVar4 + -2;
      bVar1 = 9999 < uVar3;
      uVar3 = uVar3 / 100;
    } while (bVar1);
  }
  if (uVar2 < 10) {
    pcVar4[-1] = (byte)uVar2 | 0x30;
    local_20 = pcVar4 + -1;
  }
  else {
    *(undefined2 *)(pcVar4 + -2) =
         *(undefined2 *)
          (
          "00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
          + (ulong)uVar2 * 2);
    local_20 = pcVar4 + -2;
  }
  ::fmt::v9::detail::buffer<char>::append<char>(&dest->super_buffer<char>,local_20,local_23);
  scoped_padder::~scoped_padder(&local_60);
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, memory_buf_t &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        auto field_size = ScopedPadder::count_digits(pid);
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::append_int(pid, dest);
    }